

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ev.c
# Opt level: O1

void * array_realloc(int elem,void *base,int *cur,int cnt)

{
  int iVar1;
  void *pvVar2;
  
  iVar1 = *cur + 1;
  do {
    iVar1 = iVar1 * 2;
  } while (iVar1 < cnt);
  if (0xfe0 < (uint)(iVar1 * elem)) {
    iVar1 = (int)((elem + iVar1 * elem + 0x101fU & 0xfffff000) - 0x20) / elem;
  }
  *cur = iVar1;
  pvVar2 = ev_realloc(base,(long)(elem * iVar1));
  return pvVar2;
}

Assistant:

ecb_cold
array_realloc (int elem, void *base, int *cur, int cnt)
{
  *cur = array_nextsize (elem, *cur, cnt);
  return ev_realloc (base, elem * *cur);
}